

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::decodeString(OurReader *this,Token *token)

{
  ushort uVar1;
  Value *pVVar2;
  _Elt_pointer ppVVar3;
  Location pCVar4;
  bool bVar5;
  char *pcVar6;
  _Elt_pointer ppVVar7;
  _Elt_pointer ppVVar8;
  ushort uVar9;
  Value decoded;
  string decoded_string;
  ValueHolder local_70;
  ushort local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  bVar5 = decodeString(this,token,&local_48);
  if (bVar5) {
    uVar9 = local_68 & 0xfe00;
    local_68 = uVar9 + 0x104;
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    pcVar6 = duplicateAndPrefixStringValue
                       (local_48._M_dataplus._M_p,(uint)local_48._M_string_length);
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar2 = ppVVar7[-1];
    uVar1 = *(ushort *)&pVVar2->field_0x8;
    pVVar2->field_0x8 = 4;
    local_70.string_ = *(char **)&pVVar2->value_;
    (pVVar2->value_).string_ = pcVar6;
    *(ushort *)&pVVar2->field_0x8 = uVar1 & 0xff04 | 0x104;
    local_68 = uVar1 & 0x100 | uVar9 | uVar1 & 0xff;
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar8 = ppVVar7;
    if (ppVVar7 == ppVVar3) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar4 = this->begin_;
    ppVVar8[-1]->start_ = (long)token->start_ - (long)pCVar4;
    if (ppVVar7 == ppVVar3) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar7[-1]->limit_ = (long)token->end_ - (long)pCVar4;
    Value::~Value((Value *)&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return bVar5;
}

Assistant:

bool OurReader::decodeString(Token& token) {
  JSONCPP_STRING decoded_string;
  if (!decodeString(token, decoded_string))
    return false;
  Value decoded(decoded_string);
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}